

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O3

gs_expr_t * gs_parse_expr_comparison(gs_parser_t *parser)

{
  char cVar1;
  gs_token_type gVar2;
  gs_token_t *pgVar3;
  anon_union_8_5_f029217d_for_gs_token_3 aVar4;
  anon_union_8_5_f029217d_for_gs_token_3 aVar5;
  gs_token_t *pgVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined8 uVar12;
  byte bVar13;
  _Bool _Var14;
  gs_expr_t *pgVar15;
  long lVar16;
  gs_expr_t *pgVar17;
  gs_expr_t *pgVar18;
  int iVar19;
  int iVar20;
  undefined8 in_RSI;
  gs_token_t token;
  gs_token_t token_1;
  gs_token_type local_58;
  int iStack_54;
  int iStack_50;
  undefined4 uStack_4c;
  gs_token_type local_38;
  int iStack_34;
  int iStack_30;
  undefined4 uStack_2c;
  
  pgVar3 = (parser->tokens).data;
  iVar20 = parser->cur_token;
  aVar4 = pgVar3[iVar20].field_3;
  pgVar6 = pgVar3 + iVar20;
  uVar7 = pgVar6->type;
  uVar8 = pgVar6->line;
  uVar9 = *(undefined8 *)&pgVar6->col;
  pgVar6 = pgVar3 + iVar20;
  uVar10 = pgVar6->type;
  uVar11 = pgVar6->line;
  uVar12 = *(undefined8 *)&pgVar6->col;
  aVar5 = pgVar3[iVar20].field_3;
  pgVar15 = gs_parse_expr_factor(parser);
  bVar13 = parser->error;
  if ((_Bool)bVar13 != false) {
LAB_00138905:
    if ((bVar13 & 1) != 0) {
      return pgVar15;
    }
    do {
      iVar20 = (int)in_RSI;
      _Var14 = gs_eat_char_n(parser,iVar20,0x3d,0x3d);
      if (_Var14) {
        pgVar17 = gs_parse_expr_comparison(parser);
        if (parser->error != false) {
          return pgVar15;
        }
        iVar20 = 8;
      }
      else {
        _Var14 = gs_eat_char_n(parser,iVar20,0x3c,0x3d);
        if (_Var14) {
          pgVar17 = gs_parse_expr_comparison(parser);
          if (parser->error != false) {
            return pgVar15;
          }
          iVar20 = 6;
        }
        else {
          _Var14 = gs_eat_char_n(parser,iVar20,0x3e,0x3d);
          if (_Var14) {
            pgVar17 = gs_parse_expr_comparison(parser);
            if (parser->error != false) {
              return pgVar15;
            }
            iVar20 = 7;
          }
          else {
            pgVar6 = (parser->tokens).data;
            iVar20 = parser->cur_token;
            gVar2 = pgVar6[iVar20].type;
            cVar1 = pgVar6[iVar20].field_3.c;
            if (cVar1 == '>' && gVar2 == GS_TOKEN_CHAR) {
              if (iVar20 < (parser->tokens).length) {
                parser->cur_token = iVar20 + 1;
              }
              pgVar17 = gs_parse_expr_comparison(parser);
              if (parser->error != false) {
                return pgVar15;
              }
              iVar20 = 5;
            }
            else {
              if (gVar2 != GS_TOKEN_CHAR) {
                return pgVar15;
              }
              if (cVar1 != '<') {
                return pgVar15;
              }
              if (iVar20 < (parser->tokens).length) {
                parser->cur_token = iVar20 + 1;
              }
              pgVar17 = gs_parse_expr_comparison(parser);
              if (parser->error != false) {
                return pgVar15;
              }
              iVar20 = 4;
            }
          }
        }
      }
      in_RSI = 0x40;
      pgVar18 = (gs_expr_t *)gs_parser_alloc(parser,0x40);
      pgVar18->type = GS_EXPR_BINARY_OP;
      iStack_50 = (int)uVar9;
      uStack_4c = (undefined4)((ulong)uVar9 >> 0x20);
      (pgVar18->token).type = uVar7;
      (pgVar18->token).line = uVar8;
      (pgVar18->token).col = iStack_50;
      *(undefined4 *)&(pgVar18->token).field_0xc = uStack_4c;
      (pgVar18->token).field_3 = aVar4;
      (pgVar18->field_2).int_val = iVar20;
      (pgVar18->field_2).binary_op.left = pgVar15;
      (pgVar18->field_2).binary_op.right = pgVar17;
      pgVar15 = pgVar18;
    } while( true );
  }
  do {
    pgVar6 = (parser->tokens).data;
    iVar20 = parser->cur_token;
    lVar16 = (long)iVar20;
    gVar2 = pgVar6[lVar16].type;
    cVar1 = pgVar6[lVar16].field_3.c;
    in_RSI = CONCAT71((int7)((ulong)(lVar16 * 3) >> 8),gVar2 == GS_TOKEN_CHAR);
    if (cVar1 == '+' && gVar2 == GS_TOKEN_CHAR) {
      iVar19 = 0;
    }
    else {
      if ((gVar2 != GS_TOKEN_CHAR) || (cVar1 != '-')) {
        bVar13 = parser->error;
        goto LAB_00138905;
      }
      iVar19 = 1;
    }
    if (iVar20 < (parser->tokens).length) {
      parser->cur_token = iVar20 + 1;
    }
    pgVar17 = gs_parse_expr_factor(parser);
    bVar13 = parser->error;
    if ((_Bool)bVar13 != false) goto LAB_00138905;
    pgVar18 = (gs_expr_t *)gs_parser_alloc(parser,0x40);
    pgVar18->type = GS_EXPR_BINARY_OP;
    iStack_30 = (int)uVar12;
    uStack_2c = (undefined4)((ulong)uVar12 >> 0x20);
    (pgVar18->token).type = uVar10;
    (pgVar18->token).line = uVar11;
    (pgVar18->token).col = iStack_30;
    *(undefined4 *)&(pgVar18->token).field_0xc = uStack_2c;
    (pgVar18->token).field_3 = aVar5;
    (pgVar18->field_2).int_val = iVar19;
    (pgVar18->field_2).binary_op.left = pgVar15;
    (pgVar18->field_2).binary_op.right = pgVar17;
    pgVar15 = pgVar18;
  } while( true );
}

Assistant:

static gs_expr_t *gs_parse_expr_comparison(gs_parser_t *parser) {
    gs_token_t token = gs_peek(parser);
    gs_expr_t *expr = gs_parse_expr_term(parser);
    if (parser->error) goto cleanup;

    while (true) {
        if (gs_eat_char_n(parser, 2, '=', '=')) {
            gs_expr_t *right = gs_parse_expr_comparison(parser);
            if (parser->error) goto cleanup;

            expr = gs_expr_binary_op_new(parser, token, GS_BINARY_OP_EQ, expr, right);
        }
        else if (gs_eat_char_n(parser, 2, '<', '=')) {
            gs_expr_t *right = gs_parse_expr_comparison(parser);
            if (parser->error) goto cleanup;

            expr = gs_expr_binary_op_new(parser, token, GS_BINARY_OP_LTE, expr, right);
        }
        else if (gs_eat_char_n(parser, 2, '>', '=')) {
            gs_expr_t *right = gs_parse_expr_comparison(parser);
            if (parser->error) goto cleanup;

            expr = gs_expr_binary_op_new(parser, token, GS_BINARY_OP_GTE, expr, right);
        }
        else if (gs_eat_char(parser, '>')) {
            gs_expr_t *right = gs_parse_expr_comparison(parser);
            if (parser->error) goto cleanup;

            expr = gs_expr_binary_op_new(parser, token, GS_BINARY_OP_GT, expr, right);
        }
        else if (gs_eat_char(parser, '<')) {
            gs_expr_t *right = gs_parse_expr_comparison(parser);
            if (parser->error) goto cleanup;

            expr = gs_expr_binary_op_new(parser, token, GS_BINARY_OP_LT, expr, right);
        }
        else {
            break;
        }
    }

cleanup:
    return expr;
}